

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-extended-kalman-filter.hxx
# Opt level: O0

StateVector * __thiscall
stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_0U>::prediction_
          (StateVector *__return_storage_ptr__,ExtendedKalmanFilter<4U,_3U,_0U> *this,uint k)

{
  DynamicsFunctorBase *pDVar1;
  bool *pbVar2;
  uint *puVar3;
  MatrixT local_68;
  MatrixT local_48;
  Matrix<double,_0,_1,_0,_0,_1> local_1d;
  uint local_1c;
  InputVector u;
  ExtendedKalmanFilter<4U,_3U,_0U> *pEStack_18;
  uint k_local;
  ExtendedKalmanFilter<4U,_3U,_0U> *this_local;
  
  local_1c = k;
  pEStack_18 = this;
  Eigen::Matrix<double,_0,_1,_0,_0,_1>::Matrix(&local_1d);
  pbVar2 = IndexedMatrix<4U,_1U>::isSet(&this->xbar_);
  if (((*pbVar2 & 1U) == 0) ||
     (puVar3 = IndexedMatrix<4U,_1U>::getTime(&this->xbar_), *puVar3 != local_1c)) {
    if (this->f_ == (DynamicsFunctorBase *)0x0) {
      __assert_fail("f_!=0x0 && \"ERROR: The Kalman filter functor is not set\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-extended-kalman-filter.hxx"
                    ,0x23,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::ExtendedKalmanFilter<4, 3>::prediction_(unsigned int) [n = 4, m = 3, p = 0]"
                   );
    }
    pDVar1 = this->f_;
    IndexedMatrix<4U,_1U>::operator()
              (&local_68,
               &(this->super_KalmanFilterBase<4U,_3U,_0U>).super_ZeroDelayObserver<4U,_3U,_0U>.x_);
    puVar3 = IndexedMatrix<4U,_1U>::getTime
                       (&(this->super_KalmanFilterBase<4U,_3U,_0U>).
                         super_ZeroDelayObserver<4U,_3U,_0U>.x_);
    (**pDVar1->_vptr_DynamicsFunctorBase)(&local_48,pDVar1,&local_68,&local_1d,(ulong)*puVar3);
    IndexedMatrix<4U,_1U>::set(&this->xbar_,&local_48,local_1c);
  }
  IndexedMatrix<4U,_1U>::operator()(__return_storage_ptr__,&this->xbar_);
  return __return_storage_ptr__;
}

Assistant:

typename ObserverBase<n,m,p>::StateVector ExtendedKalmanFilter<n,m,p>::prediction_(unsigned k)
{
    typename ObserverBase<n,m,p>::InputVector u;

    if (p>0)
        u=this->u_[0]();


    if (!this->xbar_.isSet() || this->xbar_.getTime()!=k)
    {
        BOOST_ASSERT (f_!=0x0 && "ERROR: The Kalman filter functor is not set");
        xbar_.set(f_->stateDynamics(
                      this->x_(),
                      u,
                      this->x_.getTime()),
                  k);
    }
    return xbar_();
}